

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectionAddressFilter.cpp
# Opt level: O0

void __thiscall
KDIS::NETWORK::ConnectionAddressFilter::RemoveAddress(ConnectionAddressFilter *this,KString *A)

{
  bool bVar1;
  _Self local_28;
  _Self local_20;
  iterator itr;
  KString *A_local;
  ConnectionAddressFilter *this_local;
  
  itr._M_node = (_Base_ptr)A;
  local_20._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(&this->m_Filter,A);
  local_28._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->m_Filter);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (bVar1) {
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    erase_abi_cxx11_((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->m_Filter,(const_iterator)local_20._M_node);
  }
  return;
}

Assistant:

void ConnectionAddressFilter::RemoveAddress( const KString & A )
{
	set<KString>::iterator itr = m_Filter.find( A );
	if( itr != m_Filter.end() )
	{
		// If we found the address then remove it.
		m_Filter.erase( itr );
	}
}